

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  PmaWriter *p;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  i64 iEof;
  int nKey;
  PmaReader *pReader;
  MergeEngine *pMerger;
  SortSubtask *pTask;
  SorterFile *pOut;
  i64 iStart;
  int rc2;
  int rc;
  int dummy;
  PmaWriter writer;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  PmaWriter *in_stack_ffffffffffffff70;
  PmaWriter *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int *pbEof;
  MergeEngine *pMerger_00;
  int local_4c;
  undefined1 local_38 [24];
  int local_20;
  long local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  lVar1 = in_RDI[2];
  pMerger_00 = (MergeEngine *)(in_RDI + 7);
  pbEof = (int *)*in_RDI;
  lVar2 = in_RDI[1];
  memset(local_38,0xaa,0x30);
  vdbePmaWriterInit((sqlite3_file *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while (local_4c == 0) {
    lVar5 = *(long *)(lVar2 + 0x18) + (long)*(int *)(*(long *)(lVar2 + 0x10) + 4) * 0x50;
    iVar4 = *(int *)(lVar5 + 0x14);
    p = (PmaWriter *)(local_18 + local_20);
    if (*(long *)(lVar5 + 0x18) == 0) break;
    in_stack_ffffffffffffff70 = (PmaWriter *)((long)&p->eFWErr + (long)iVar4);
    iVar3 = sqlite3VarintLen((long)iVar4);
    if (lVar1 + *(int *)(in_RDI + 3) < (long)&in_stack_ffffffffffffff70->eFWErr + (long)iVar3)
    break;
    vdbePmaWriteVarint(p,(u64)in_stack_ffffffffffffff70);
    vdbePmaWriteBlob((PmaWriter *)CONCAT44(iVar4,in_stack_ffffffffffffff80),(u8 *)p,
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    local_4c = vdbeMergeEngineStep(pMerger_00,pbEof);
  }
  iVar4 = vdbePmaWriterFinish(in_stack_ffffffffffffff70,
                              (i64 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (local_4c == 0) {
    local_4c = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}